

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O2

TableFunction * duckdb::ReadCSVTableFunction::GetFunction(void)

{
  TableFunction *in_RDI;
  MultiFileFunction<duckdb::CSVMultiFileInfo> read_csv;
  allocator local_1e1;
  string local_1e0;
  TableFunction local_1c0;
  
  ::std::__cxx11::string::string((string *)&local_1e0,"read_csv",&local_1e1);
  MultiFileFunction<duckdb::CSVMultiFileInfo>::MultiFileFunction
            ((MultiFileFunction<duckdb::CSVMultiFileInfo> *)&local_1c0,&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  local_1c0.serialize = CSVReaderSerialize;
  local_1c0.deserialize = CSVReaderDeserialize;
  local_1c0.type_pushdown = MultiFileFunction<duckdb::CSVMultiFileInfo>::PushdownType;
  ReadCSVAddNamedParameters(&local_1c0);
  TableFunction::TableFunction(in_RDI,&local_1c0);
  TableFunction::~TableFunction(&local_1c0);
  return in_RDI;
}

Assistant:

TableFunction ReadCSVTableFunction::GetFunction() {
	MultiFileFunction<CSVMultiFileInfo> read_csv("read_csv");
	read_csv.serialize = CSVReaderSerialize;
	read_csv.deserialize = CSVReaderDeserialize;
	read_csv.type_pushdown = MultiFileFunction<CSVMultiFileInfo>::PushdownType;
	ReadCSVAddNamedParameters(read_csv);
	return static_cast<TableFunction>(read_csv);
}